

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding_map.cpp
# Opt level: O0

void __thiscall r_exec::HLPBindingMap::init_from_f_ihlp(HLPBindingMap *this,_Fact *f_ihlp)

{
  ulong uVar1;
  byte bVar2;
  char cVar3;
  undefined1 uVar4;
  ushort uVar5;
  ushort uVar6;
  uint16_t uVar7;
  short sVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectValue *pOVar10;
  undefined4 extraout_var_01;
  StructureValue *pSVar11;
  AtomValue *pAVar12;
  reference pvVar13;
  size_type sVar14;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  uint uVar15;
  undefined8 uVar16;
  uint *puVar17;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined4 local_60;
  undefined4 local_5c;
  Atom atom_1;
  ulong uStack_58;
  uint64_t j;
  uint64_t i;
  undefined4 local_40;
  uint16_t val_set_index;
  undefined4 local_2c;
  ushort local_26;
  Atom atom;
  uint16_t i_1;
  uint16_t tpl_val_count;
  uint16_t tpl_val_set_index;
  Code *ihlp;
  _Fact *f_ihlp_local;
  HLPBindingMap *this_local;
  Code *source;
  
  iVar9 = (*(f_ihlp->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[9])(f_ihlp,0);
  source = (Code *)CONCAT44(extraout_var,iVar9);
  (*(source->super__Object)._vptr__Object[4])(source,2);
  uVar5 = r_code::Atom::asIndex();
  (*(source->super__Object)._vptr__Object[4])(source,(ulong)uVar5);
  bVar2 = r_code::Atom::getAtomCount();
  _atom = (ushort)bVar2;
  uVar16 = extraout_RDX;
  for (local_26 = 0; local_26 < _atom; local_26 = local_26 + 1) {
    uVar15 = (uint)(ushort)(uVar5 + 1) + (uint)local_26;
    iVar9 = (*(source->super__Object)._vptr__Object[4])
                      (source,(ulong)(ushort)uVar15,uVar16,(ulong)uVar15);
    local_2c = *(undefined4 *)CONCAT44(extraout_var_00,iVar9);
    cVar3 = r_code::Atom::getDescriptor();
    uVar16 = 0;
    if (cVar3 == -0x7c) {
      pSVar11 = (StructureValue *)operator_new(0x20);
      uVar7 = r_code::Atom::asIndex();
      StructureValue::StructureValue(pSVar11,&this->super_BindingMap,source,uVar7);
      pvVar13 = std::vector<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>::
                operator[](&(this->super_BindingMap).map,(ulong)local_26);
      core::P<r_exec::Value>::operator=(pvVar13,(Value *)pSVar11);
    }
    else if (cVar3 == -0x7b) {
      pOVar10 = (ObjectValue *)operator_new(0x20);
      uVar6 = r_code::Atom::asIndex();
      iVar9 = (*(source->super__Object)._vptr__Object[9])
                        (source,(ulong)uVar6,extraout_RDX_00,
                         CONCAT62((int6)((ulong)uVar16 >> 0x10),uVar6));
      ObjectValue::ObjectValue
                (pOVar10,&this->super_BindingMap,(Code *)CONCAT44(extraout_var_01,iVar9));
      pvVar13 = std::vector<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>::
                operator[](&(this->super_BindingMap).map,(ulong)local_26);
      core::P<r_exec::Value>::operator=(pvVar13,(Value *)pOVar10);
    }
    else {
      pAVar12 = (AtomValue *)operator_new(0x20);
      local_40 = local_2c;
      AtomValue::AtomValue(pAVar12,&this->super_BindingMap,(Atom *)&local_40);
      pvVar13 = std::vector<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>::
                operator[](&(this->super_BindingMap).map,(ulong)local_26);
      core::P<r_exec::Value>::operator=(pvVar13,(Value *)pAVar12);
      r_code::Atom::~Atom((Atom *)&local_40);
    }
    r_code::Atom::~Atom((Atom *)&local_2c);
    uVar16 = extraout_RDX_01;
  }
  (*(source->super__Object)._vptr__Object[4])(source,3);
  sVar8 = r_code::Atom::asIndex();
  for (uStack_58 = (ulong)(this->super_BindingMap).first_index; uVar1 = uStack_58,
      sVar14 = std::vector<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>::size
                         (&(this->super_BindingMap).map), uVar1 < sVar14; uStack_58 = uStack_58 + 1)
  {
    if ((((this->super_BindingMap).fwd_after_index < 1) ||
        (uStack_58 != (long)(this->super_BindingMap).fwd_after_index)) &&
       (((this->super_BindingMap).fwd_before_index < 1 ||
        (uStack_58 != (long)(this->super_BindingMap).fwd_before_index)))) {
      iVar9 = (*(source->super__Object)._vptr__Object[4])(source,(ulong)(ushort)(sVar8 + 1));
      local_5c = *(undefined4 *)CONCAT44(extraout_var_02,iVar9);
      uVar4 = r_code::Atom::getDescriptor();
      puVar17 = &switchD_00208413::switchdataD_002a42e0;
      switch(uVar4) {
      case 0x82:
      case 0x83:
      case 0x86:
        break;
      case 0x84:
        pSVar11 = (StructureValue *)operator_new(0x20);
        uVar7 = r_code::Atom::asIndex();
        StructureValue::StructureValue(pSVar11,&this->super_BindingMap,source,uVar7);
        pvVar13 = std::vector<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>::
                  operator[](&(this->super_BindingMap).map,uStack_58);
        core::P<r_exec::Value>::operator=(pvVar13,(Value *)pSVar11);
        break;
      case 0x85:
        pOVar10 = (ObjectValue *)operator_new(0x20);
        uVar5 = r_code::Atom::asIndex();
        iVar9 = (*(source->super__Object)._vptr__Object[9])
                          (source,(ulong)uVar5,extraout_RDX_02,
                           CONCAT62((int6)((ulong)puVar17 >> 0x10),uVar5));
        ObjectValue::ObjectValue
                  (pOVar10,&this->super_BindingMap,(Code *)CONCAT44(extraout_var_03,iVar9));
        pvVar13 = std::vector<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>::
                  operator[](&(this->super_BindingMap).map,uStack_58);
        core::P<r_exec::Value>::operator=(pvVar13,(Value *)pOVar10);
        break;
      default:
        pAVar12 = (AtomValue *)operator_new(0x20);
        local_60 = local_5c;
        AtomValue::AtomValue(pAVar12,&this->super_BindingMap,(Atom *)&local_60);
        pvVar13 = std::vector<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>::
                  operator[](&(this->super_BindingMap).map,uStack_58);
        core::P<r_exec::Value>::operator=(pvVar13,(Value *)pAVar12);
        r_code::Atom::~Atom((Atom *)&local_60);
      }
      r_code::Atom::~Atom((Atom *)&local_5c);
    }
  }
  pSVar11 = (StructureValue *)operator_new(0x20);
  StructureValue::StructureValue(pSVar11,&this->super_BindingMap,(Code *)f_ihlp,2);
  pvVar13 = std::vector<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>::
            operator[](&(this->super_BindingMap).map,(long)(this->super_BindingMap).fwd_after_index)
  ;
  core::P<r_exec::Value>::operator=(pvVar13,(Value *)pSVar11);
  pSVar11 = (StructureValue *)operator_new(0x20);
  StructureValue::StructureValue(pSVar11,&this->super_BindingMap,(Code *)f_ihlp,3);
  pvVar13 = std::vector<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>::
            operator[](&(this->super_BindingMap).map,(long)(this->super_BindingMap).fwd_before_index
                      );
  core::P<r_exec::Value>::operator=(pvVar13,(Value *)pSVar11);
  return;
}

Assistant:

void HLPBindingMap::init_from_f_ihlp(const _Fact *f_ihlp)   // source is f->icst or f->imdl; map already initialized with values from hlp.
{
    Code *ihlp = f_ihlp->get_reference(0);
    uint16_t tpl_val_set_index = ihlp->code(I_HLP_TPL_ARGS).asIndex();
    uint16_t tpl_val_count = ihlp->code(tpl_val_set_index++).getAtomCount();

    for (uint16_t i = 0; i < tpl_val_count; ++i) { // valuate tpl args.
        Atom atom = ihlp->code(tpl_val_set_index + i);

        switch (atom.getDescriptor()) {
        case Atom::R_PTR:
            map[i] = new ObjectValue(this, ihlp->get_reference(atom.asIndex()));
            break;

        case Atom::I_PTR:
            map[i] = new StructureValue(this, ihlp, atom.asIndex());
            break;

        default:
            map[i] = new AtomValue(this, atom);
            break;
        }
    }

    uint16_t val_set_index = ihlp->code(I_HLP_ARGS).asIndex() + 1;
    uint64_t i = 0;

    for (uint64_t j = first_index; j < map.size(); ++j) { // valuate args.
        if ((fwd_after_index > 0 && j == uint64_t(fwd_after_index)) || (fwd_before_index > 0 && j == uint64_t(fwd_before_index))) {
            continue;
        }

        Atom atom = ihlp->code(val_set_index + i);

        switch (atom.getDescriptor()) {
        case Atom::R_PTR:
            map[j] = new ObjectValue(this, ihlp->get_reference(atom.asIndex()));
            break;

        case Atom::I_PTR:
            map[j] = new StructureValue(this, ihlp, atom.asIndex());
            break;

        case Atom::WILDCARD:
        case Atom::T_WILDCARD:
        case Atom::VL_PTR:
            break;

        default:
            map[j] = new AtomValue(this, atom);
            break;
        }
    }

    map[fwd_after_index] = new StructureValue(this, f_ihlp, FACT_AFTER); // valuate timings; fwd_after_index is already known.
    map[fwd_before_index] = new StructureValue(this, f_ihlp, FACT_BEFORE);
}